

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O3

double IF97::BackwardOutputHS(IF97parameters outkey,double h,double s)

{
  double dVar1;
  IF97BACKREGIONS IVar2;
  int iVar3;
  out_of_range *this;
  code *pcVar4;
  undefined *puVar5;
  Region3bHS *this_00;
  
  if ((BackwardOutputHS(IF97parameters,double,double)::B1HS == '\0') &&
     (iVar3 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B1HS), iVar3 != 0
     )) {
    Backwards::Region1HS::Region1HS(&BackwardOutputHS::B1HS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B1HS,&__dso_handle)
    ;
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B1HS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B2aHS == '\0') &&
     (iVar3 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B2aHS),
     iVar3 != 0)) {
    Backwards::Region2aHS::Region2aHS(&BackwardOutputHS::B2aHS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B2aHS,&__dso_handle
                );
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B2aHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B2bHS == '\0') &&
     (iVar3 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B2bHS),
     iVar3 != 0)) {
    Backwards::Region2bHS::Region2bHS(&BackwardOutputHS::B2bHS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B2bHS,&__dso_handle
                );
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B2bHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B2cHS == '\0') &&
     (iVar3 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B2cHS),
     iVar3 != 0)) {
    Backwards::Region2cHS::Region2cHS(&BackwardOutputHS::B2cHS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B2cHS,&__dso_handle
                );
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B2cHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B3aHS == '\0') &&
     (iVar3 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B3aHS),
     iVar3 != 0)) {
    Backwards::Region3aHS::Region3aHS(&BackwardOutputHS::B3aHS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B3aHS,&__dso_handle
                );
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B3aHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B3bHS == '\0') &&
     (iVar3 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B3bHS),
     iVar3 != 0)) {
    Backwards::Region3bHS::Region3bHS(&BackwardOutputHS::B3bHS);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B3bHS,&__dso_handle
                );
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B3bHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B4HS == '\0') &&
     (iVar3 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B4HS), iVar3 != 0
     )) {
    Backwards::BackwardsRegion::BackwardsRegion
              (&BackwardOutputHS::B4HS.super_BackwardsRegion,
               (BackwardRegionResidualElement *)Backwards::CoeffT4HS,0x24);
    BackwardOutputHS::B4HS.super_BackwardsRegion._vptr_BackwardsRegion =
         (_func_int **)&PTR_T_pX_00122bb8;
    BackwardOutputHS::B4HS.super_BackwardsRegion.s_star = 9.2;
    BackwardOutputHS::B4HS.super_BackwardsRegion.T_star = 550.0;
    BackwardOutputHS::B4HS.super_BackwardsRegion.h_star = 2800.0;
    BackwardOutputHS::B4HS.super_BackwardsRegion.a._0_4_ = 0xb4395810;
    BackwardOutputHS::B4HS.super_BackwardsRegion.a._4_4_ = 0xbfbe76c8;
    BackwardOutputHS::B4HS.super_BackwardsRegion.b._0_4_ = 0x51eb851f;
    BackwardOutputHS::B4HS.super_BackwardsRegion.b._4_4_ = 0xbff11eb8;
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&BackwardOutputHS::B4HS,&__dso_handle)
    ;
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B4HS);
  }
  if (outkey - IF97_SMASS < 0xfffffffe) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this,"Backward HS Formulas output Temperature or Pressure only.")
    ;
    puVar5 = &std::invalid_argument::typeinfo;
    pcVar4 = std::invalid_argument::~invalid_argument;
    goto LAB_0011a1c4;
  }
  IVar2 = RegionDetermination_HS(h,s);
  switch(IVar2) {
  case BACK_1:
    this_00 = (Region3bHS *)&BackwardOutputHS::B1HS;
    break;
  case BACK_2A:
    this_00 = (Region3bHS *)&BackwardOutputHS::B2aHS;
    break;
  case BACK_2B:
    this_00 = (Region3bHS *)&BackwardOutputHS::B2bHS;
    break;
  case BACK_2C:
    this_00 = (Region3bHS *)&BackwardOutputHS::B2cHS;
    break;
  case BACK_3A:
    this_00 = (Region3bHS *)&BackwardOutputHS::B3aHS;
    break;
  case BACK_3B:
    this_00 = &BackwardOutputHS::B3bHS;
    break;
  case BACK_4:
    if (5.210887825 <= s) {
      dVar1 = Backwards::BackwardsRegion::t_hs(&BackwardOutputHS::B4HS.super_BackwardsRegion,h,s);
      if (outkey != IF97_P) {
        return dVar1;
      }
      if ((psat97(double)::R4 == '\0') &&
         (iVar3 = __cxa_guard_acquire(&psat97(double)::R4), iVar3 != 0)) {
        Region4::Region4((Region4 *)psat97(double)::R4);
        __cxa_atexit(Region4::~Region4,psat97(double)::R4,&__dso_handle);
        __cxa_guard_release(&psat97(double)::R4);
      }
      dVar1 = Region4::p_T((Region4 *)psat97(double)::R4,dVar1);
      return dVar1;
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Entropy out of range");
    goto LAB_0011a1b6;
  default:
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Unable to match region");
LAB_0011a1b6:
    puVar5 = &std::out_of_range::typeinfo;
    pcVar4 = std::out_of_range::~out_of_range;
LAB_0011a1c4:
    __cxa_throw(this,puVar5,pcVar4);
  }
  dVar1 = Backwards::BackwardsRegion::p_hs(&this_00->super_BackwardsRegion,h,s);
  if (outkey == IF97_P) {
    return dVar1;
  }
  dVar1 = RegionOutputBackward(dVar1,h,IF97_HMASS,false,NONE);
  return dVar1;
}

Assistant:

inline double BackwardOutputHS(IF97parameters outkey,double h, double s){
        // Note that this routine returns only temperature (IF97_T).  All other values should be
        // calculated from this temperature and the known pressure using forward equations.
        // Setup Backward Regions for output
        static Backwards::Region1HS B1HS;
        static Backwards::Region2aHS B2aHS;
        static Backwards::Region2bHS B2bHS;
        static Backwards::Region2cHS B2cHS;
        static Backwards::Region3aHS B3aHS;
        static Backwards::Region3bHS B3bHS;
        static Backwards::Region4HS B4HS;
        //
        double Pval, Tval;

        // Make sure output keys are valid for Backward_HS formulas
        if ((outkey != IF97_P) && (outkey != IF97_T))
            throw std::invalid_argument("Backward HS Formulas output Temperature or Pressure only.");

        // Get Saturation Parameters

        IF97BACKREGIONS region = RegionDetermination_HS(h, s);

        switch (region){
        case BACK_1:   Pval = B1HS.p_hs(h,s);  break;
        case BACK_2A:  Pval = B2aHS.p_hs(h,s); break;
        case BACK_2B:  Pval = B2bHS.p_hs(h,s); break;
        case BACK_2C:  Pval = B2cHS.p_hs(h,s); break;
        case BACK_3A:  Pval = B3aHS.p_hs(h,s); break;
        case BACK_3B:  Pval = B3bHS.p_hs(h,s); break;
        case BACK_4:   if (s >= SgT23)   // T(h,s) only defined over part of the 2-phase region
                           Tval = B4HS.t_hs(h,s);
                       else
                           throw std::out_of_range("Entropy out of range");
                       break;
        default: throw std::out_of_range("Unable to match region");
        }
        if (outkey == IF97_P)            // Returning Pressure (IF97_P)
            if (region == BACK_4)        //
                return psat97(Tval);     //       Not REGION 4, already have pressure
            else                         // 
                return Pval;             //       REGION 4, Calculate Psat from Tsat
                                         //
        else                             // ELSE Returning Temperature
            if (region == BACK_4)        //
                return Tval;                                     // REGION 4, already have Temperature
            else                                                 //
                return RegionOutputBackward(Pval,h,IF97_HMASS,false,NONE);  // Not REGION 4 Calc from Backward T(p,h)
    }